

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

bool __thiscall ninx::lexer::token::Text::is_empty(Text *this)

{
  bool bVar1;
  int iVar2;
  
  if ((this->text)._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    if (this->valid_newline == false) {
      if (is_empty()::emptyValidation == '\0') {
        iVar2 = __cxa_guard_acquire(&is_empty()::emptyValidation);
        if (iVar2 != 0) {
          boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
          basic_regex(&is_empty::emptyValidation,"^[\\s]+$",0);
          __cxa_atexit(boost::
                       basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                       ::~basic_regex,&is_empty::emptyValidation,&__dso_handle);
          __cxa_guard_release(&is_empty()::emptyValidation);
        }
      }
      bVar1 = boost::
              regex_match<std::char_traits<char>,std::allocator<char>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (&this->text,&is_empty::emptyValidation,format_default);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ninx::lexer::token::Text::is_empty() {
    // Check if the text is empty or contain only spaces
    if (this->text.length() == 0) {
        return true;
    }

    if (valid_newline) {
        return false;
    }

    static const boost::regex emptyValidation("^[\\s]+$");
    return regex_match(this->get_text(), emptyValidation);
}